

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O0

FT_Error cid_hex_to_binary(FT_Byte *data,FT_ULong data_len,FT_ULong offset,CID_Face face,
                          FT_ULong *data_written)

{
  FT_Stream stream_00;
  bool bVar1;
  FT_ULong FVar2;
  FT_ULong FVar3;
  FT_ULong local_198;
  FT_ULong size;
  FT_ULong oldpos;
  FT_Bool done;
  FT_Bool upper_nibble;
  FT_Byte val;
  FT_Byte *dlimit;
  FT_Byte *d;
  FT_Byte *plimit;
  FT_Byte *p;
  FT_Byte buffer [256];
  FT_Error local_3c;
  FT_Error error;
  FT_Stream stream;
  FT_ULong *data_written_local;
  CID_Face face_local;
  FT_ULong offset_local;
  FT_ULong data_len_local;
  FT_Byte *data_local;
  
  stream_00 = (face->root).stream;
  local_3c = FT_Stream_Seek(stream_00,offset);
  dlimit = data;
  if (local_3c == 0) {
    d = (FT_Byte *)&p;
    oldpos._6_1_ = '\x01';
    bVar1 = false;
    plimit = d;
    while (dlimit < data + data_len) {
      if (d <= plimit) {
        FVar2 = FT_Stream_Pos(stream_00);
        local_198 = stream_00->size - FVar2;
        if (local_198 == 0) {
          local_3c = 0xa0;
          goto LAB_002fa061;
        }
        if (0xff < local_198) {
          local_198 = 0x100;
        }
        local_3c = FT_Stream_Read(stream_00,(FT_Byte *)&p,local_198);
        if (local_3c != 0) goto LAB_002fa061;
        plimit = (FT_Byte *)&p;
        FVar3 = FT_Stream_Pos(stream_00);
        d = (FT_Byte *)((long)plimit + (FVar3 - FVar2));
      }
      if (*plimit - 0x30 < 10) {
        oldpos._7_1_ = *plimit + 0xd0;
LAB_002f9fd4:
        if (oldpos._6_1_ == '\0') {
          *dlimit = *dlimit + oldpos._7_1_;
          dlimit = dlimit + 1;
        }
        else {
          *dlimit = oldpos._7_1_ << 4;
        }
        oldpos._6_1_ = '\x01' - oldpos._6_1_;
        if (bVar1) break;
        plimit = plimit + 1;
      }
      else {
        if ((0x60 < *plimit) && (*plimit < 0x67)) {
          oldpos._7_1_ = *plimit + 0xa9;
          goto LAB_002f9fd4;
        }
        if ((0x40 < *plimit) && (*plimit < 0x47)) {
          oldpos._7_1_ = *plimit + 0xc9;
          goto LAB_002f9fd4;
        }
        if ((((*plimit != ' ') && (*plimit != '\t')) && (*plimit != '\r')) &&
           (((*plimit != '\n' && (*plimit != '\f')) && (*plimit != '\0')))) {
          if (*plimit == '>') {
            oldpos._7_1_ = '\0';
            bVar1 = true;
            goto LAB_002f9fd4;
          }
          local_3c = 0xa0;
          goto LAB_002fa061;
        }
        plimit = plimit + 1;
      }
    }
    local_3c = 0;
  }
LAB_002fa061:
  *data_written = (long)dlimit - (long)data;
  return local_3c;
}

Assistant:

static FT_Error
  cid_hex_to_binary( FT_Byte*   data,
                     FT_ULong   data_len,
                     FT_ULong   offset,
                     CID_Face   face,
                     FT_ULong*  data_written )
  {
    FT_Stream  stream = face->root.stream;
    FT_Error   error;

    FT_Byte    buffer[256];
    FT_Byte   *p, *plimit;
    FT_Byte   *d = data, *dlimit;
    FT_Byte    val;

    FT_Bool    upper_nibble, done;


    if ( FT_STREAM_SEEK( offset ) )
      goto Exit;

    dlimit = d + data_len;
    p      = buffer;
    plimit = p;

    upper_nibble = 1;
    done         = 0;

    while ( d < dlimit )
    {
      if ( p >= plimit )
      {
        FT_ULong  oldpos = FT_STREAM_POS();
        FT_ULong  size   = stream->size - oldpos;


        if ( size == 0 )
        {
          error = FT_THROW( Syntax_Error );
          goto Exit;
        }

        if ( FT_STREAM_READ( buffer, 256 > size ? size : 256 ) )
          goto Exit;
        p      = buffer;
        plimit = p + FT_STREAM_POS() - oldpos;
      }

      if ( ft_isdigit( *p ) )
        val = (FT_Byte)( *p - '0' );
      else if ( *p >= 'a' && *p <= 'f' )
        val = (FT_Byte)( *p - 'a' + 10 );
      else if ( *p >= 'A' && *p <= 'F' )
        val = (FT_Byte)( *p - 'A' + 10 );
      else if ( *p == ' '  ||
                *p == '\t' ||
                *p == '\r' ||
                *p == '\n' ||
                *p == '\f' ||
                *p == '\0' )
      {
        p++;
        continue;
      }
      else if ( *p == '>' )
      {
        val  = 0;
        done = 1;
      }
      else
      {
        error = FT_THROW( Syntax_Error );
        goto Exit;
      }

      if ( upper_nibble )
        *d = (FT_Byte)( val << 4 );
      else
      {
        *d = (FT_Byte)( *d + val );
        d++;
      }

      upper_nibble = (FT_Byte)( 1 - upper_nibble );

      if ( done )
        break;

      p++;
    }

    error = FT_Err_Ok;

  Exit:
    *data_written = (FT_ULong)( d - data );
    return error;
  }